

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstraintElem.hpp
# Opt level: O1

void __thiscall OpenMD::ConstraintElem::ConstraintElem(ConstraintElem *this,StuntDouble *sd)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  StuntDouble *pSVar2;
  SimpleTypeData<bool> *pSVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  element_type *peVar5;
  SimpleTypeData<bool> *__tmp;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  SimpleTypeData<bool> *__tmp_1;
  shared_ptr<OpenMD::GenericData> movingData;
  shared_ptr<OpenMD::GenericData> movedData;
  undefined1 local_89;
  SimpleTypeData<bool> *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_80;
  undefined1 local_78 [24];
  undefined1 local_60 [16];
  shared_ptr<OpenMD::GenericData> local_50;
  shared_ptr<OpenMD::GenericData> local_40;
  undefined1 local_30 [16];
  
  this->sd_ = sd;
  (this->moved_).super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->moved_).super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->moving_).super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->moving_).super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_88 = (SimpleTypeData<bool> *)local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Moved","");
  StuntDouble::getPropertyByName((StuntDouble *)local_30,(string *)sd);
  if (local_88 != (SimpleTypeData<bool> *)local_78) {
    operator_delete(local_88,local_78._0_8_ + 1);
  }
  if ((_func_int **)local_30._0_8_ == (_func_int **)0x0) {
    local_88 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<OpenMD::SimpleTypeData<bool>,std::allocator<OpenMD::SimpleTypeData<bool>>,char_const(&)[6]>
              (&_Stack_80,&local_88,(allocator<OpenMD::SimpleTypeData<bool>_> *)local_60,
               (char (*) [6])"Moved");
    _Var4._M_pi = _Stack_80._M_pi;
    pSVar3 = local_88;
    local_88 = (SimpleTypeData<bool> *)0x0;
    _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var7 = (this->moved_).
             super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->moved_).super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = pSVar3;
    (this->moved_).super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var4._M_pi;
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
    }
    if (_Stack_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_80._M_pi);
    }
    pSVar2 = this->sd_;
    local_40.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &((this->moved_).
           super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          super_GenericData;
    local_40.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->moved_).super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    if (local_40.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_40.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_40.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_40.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_40.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    StuntDouble::addProperty(pSVar2,&local_40);
    if (local_40.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  else {
    peVar5 = (element_type *)
             __dynamic_cast(local_30._0_8_,&GenericData::typeinfo,&SimpleTypeData<bool>::typeinfo,0)
    ;
    peVar6 = (element_type *)0x0;
    p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((peVar5 != (element_type *)0x0) &&
       (peVar6 = peVar5, p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._8_8_,
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._8_8_ !=
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_30._8_8_ + 8) = *(_Atomic_word *)(local_30._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_30._8_8_ + 8) = *(_Atomic_word *)(local_30._8_8_ + 8) + 1;
      }
    }
    (this->moved_).super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar6;
    p_Var1 = (this->moved_).
             super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->moved_).super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var7;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    if ((this->moved_).super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0) {
      memcpy(&painCave,
             "Generic Data with keyword Moved exists, however, it can not be casted to a BoolGenericData.\n"
             ,0x5d);
      painCave.isFatal = 1;
      simError();
    }
  }
  pSVar2 = this->sd_;
  local_88 = (SimpleTypeData<bool> *)local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Moving","");
  StuntDouble::getPropertyByName((StuntDouble *)local_60,(string *)pSVar2);
  if (local_88 != (SimpleTypeData<bool> *)local_78) {
    operator_delete(local_88,local_78._0_8_ + 1);
  }
  if ((_func_int **)local_60._0_8_ == (_func_int **)0x0) {
    local_88 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<OpenMD::SimpleTypeData<bool>,std::allocator<OpenMD::SimpleTypeData<bool>>,char_const(&)[7]>
              (&_Stack_80,&local_88,(allocator<OpenMD::SimpleTypeData<bool>_> *)&local_89,
               (char (*) [7])"Moving");
    _Var4._M_pi = _Stack_80._M_pi;
    pSVar3 = local_88;
    local_88 = (SimpleTypeData<bool> *)0x0;
    _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var7 = (this->moving_).
             super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->moving_).super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = pSVar3;
    (this->moving_).super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var4._M_pi;
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
    }
    if (_Stack_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_80._M_pi);
    }
    pSVar2 = this->sd_;
    local_50.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &((this->moving_).
           super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          super_GenericData;
    local_50.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->moving_).
         super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if ((SnapshotManager *)
        local_50.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (SnapshotManager *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((SnapshotManager *)
        local_50.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->atomStorageLayout_ =
             ((SnapshotManager *)
             local_50.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->atomStorageLayout_ + 1;
        UNLOCK();
      }
      else {
        ((SnapshotManager *)
        local_50.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->atomStorageLayout_ =
             ((SnapshotManager *)
             local_50.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->atomStorageLayout_ + 1;
      }
    }
    StuntDouble::addProperty(pSVar2,&local_50);
    if ((SnapshotManager *)
        local_50.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (SnapshotManager *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_50.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  else {
    peVar5 = (element_type *)
             __dynamic_cast(local_60._0_8_,&GenericData::typeinfo,&SimpleTypeData<bool>::typeinfo,0)
    ;
    p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    peVar6 = (element_type *)0x0;
    if ((peVar5 != (element_type *)0x0) &&
       (p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_, peVar6 = peVar5,
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_60._8_8_ + 8) = *(_Atomic_word *)(local_60._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_60._8_8_ + 8) = *(_Atomic_word *)(local_60._8_8_ + 8) + 1;
      }
    }
    (this->moving_).super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar6;
    p_Var1 = (this->moving_).
             super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->moving_).super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var7;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    if ((this->moving_).super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (element_type *)0x0) {
      memcpy(&painCave,
             "Generic Data with keyword Moving exists, however, it can not be casted to a BoolGenericData.\n"
             ,0x5e);
      painCave.isFatal = 1;
      simError();
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._8_8_);
  }
  return;
}

Assistant:

ConstraintElem(StuntDouble* sd) : sd_(sd) {
      std::shared_ptr<GenericData> movedData = sd_->getPropertyByName("Moved");
      if (movedData != nullptr) {  // if generic data with keyword "moved"
                                   // exists, assign it to moved_
        moved_ = std::dynamic_pointer_cast<BoolGenericData>(movedData);
        if (moved_ == nullptr) {
          snprintf(
              painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
              "Generic Data with keyword Moved exists, however, it can not "
              "be casted to a BoolGenericData.\n");
          painCave.isFatal = 1;
          ;
          simError();
        }
      } else {  // if generic data with keyword "moved" does not exist, create
                // it
        moved_ = std::make_shared<BoolGenericData>("Moved");
        sd_->addProperty(moved_);
      }

      std::shared_ptr<GenericData> movingData =
          sd_->getPropertyByName("Moving");
      if (movingData != nullptr) {
        moving_ = std::dynamic_pointer_cast<BoolGenericData>(movingData);
        if (moving_ == nullptr) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "Generic Data with keyword Moving exists, however, it can "
                   "not be casted to a BoolGenericData.\n");
          painCave.isFatal = 1;
          ;
          simError();
        }
      } else {
        moving_ = std::make_shared<BoolGenericData>("Moving");
        sd_->addProperty(moving_);
      }
    }